

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O0

void nsync::nsync_note_free(nsync_note n)

{
  nsync_note_s_ *pnVar1;
  nsync_dll_element_ *e;
  int iVar2;
  nsync_dll_list_ pnVar3;
  nsync_note child;
  nsync_dll_element_ *next;
  nsync_dll_element_ *p;
  nsync_note parent;
  nsync_note n_local;
  
  nsync_mu_lock(&n->note_mu);
  n->disconnecting = n->disconnecting + 1;
  iVar2 = nsync_dll_is_empty_(n->waiters);
  if (iVar2 == 0) {
    uRam0000000000000000 = 0;
  }
  pnVar1 = n->parent;
  if ((pnVar1 != (nsync_note_s_ *)0x0) && (iVar2 = nsync_mu_trylock(&pnVar1->note_mu), iVar2 == 0))
  {
    nsync_mu_unlock(&n->note_mu);
    nsync_mu_lock(&pnVar1->note_mu);
    nsync_mu_lock(&n->note_mu);
  }
  next = nsync_dll_first_(n->children);
  while (next != (nsync_dll_element_ *)0x0) {
    e = (nsync_dll_element_ *)next->container;
    next = nsync_dll_next_(n->children,next);
    nsync_mu_lock((nsync_mu *)(e + 2));
    if (*(int *)&e[3].prev == 0) {
      pnVar3 = nsync_dll_remove_(n->children,e);
      n->children = pnVar3;
      if (pnVar1 == (nsync_note_s_ *)0x0) {
        e[3].container = (void *)0x0;
      }
      else {
        e[3].container = pnVar1;
        pnVar3 = nsync_dll_make_last_in_list_(pnVar1->children,e);
        pnVar1->children = pnVar3;
      }
    }
    nsync_mu_unlock((nsync_mu *)(e + 2));
  }
  nsync_mu_wait(&n->note_mu,no_children,n,(_func_int_void_ptr_void_ptr *)0x0);
  if (pnVar1 != (nsync_note_s_ *)0x0) {
    pnVar3 = nsync_dll_remove_(pnVar1->children,&n->parent_child_link);
    pnVar1->children = pnVar3;
    n->parent = (nsync_note_s_ *)0x0;
    nsync_mu_unlock(&pnVar1->note_mu);
  }
  n->disconnecting = n->disconnecting - 1;
  nsync_mu_unlock(&n->note_mu);
  free(n);
  return;
}

Assistant:

void nsync_note_free (nsync_note n) {
	nsync_note parent;
	nsync_dll_element_ *p;
	nsync_dll_element_ *next;
	nsync_mu_lock (&n->note_mu);
	n->disconnecting++;
	ASSERT (nsync_dll_is_empty_ (n->waiters));
	parent = n->parent;
	if (parent != NULL && !nsync_mu_trylock (&parent->note_mu)) {
		nsync_mu_unlock (&n->note_mu);
		nsync_mu_lock (&parent->note_mu);
		nsync_mu_lock (&n->note_mu);
	}
	for (p = nsync_dll_first_ (n->children); p != NULL; p = next) {
		nsync_note child = DLL_NOTE (p);
		next = nsync_dll_next_ (n->children, p);
		nsync_mu_lock (&child->note_mu);
		if (child->disconnecting == 0) {
			n->children = nsync_dll_remove_ (n->children,
							 &child->parent_child_link);
			if (parent != NULL) {
				child->parent = parent;
				parent->children = nsync_dll_make_last_in_list_ (
					parent->children, &child->parent_child_link);
			} else {
				child->parent = NULL;
			}
		}
		nsync_mu_unlock (&child->note_mu);
	}
	WAIT_FOR_NO_CHILDREN (no_children, n);
	if (parent != NULL) {
		parent->children = nsync_dll_remove_ (parent->children,
						      &n->parent_child_link);
		WAKEUP_NO_CHILDREN (parent);
		n->parent = NULL;
		nsync_mu_unlock (&parent->note_mu);
	}
	n->disconnecting--;
	nsync_mu_unlock (&n->note_mu);
	free (n);
}